

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::EnumFirstLastMethod::~EnumFirstLastMethod(EnumFirstLastMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~EnumFirstLastMethod((EnumFirstLastMethod *)0x933f28);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

EnumFirstLastMethod(KnownSystemName knownNameId, bool first) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), first(first) {}